

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::BamReaderPrivate::GetErrorString_abi_cxx11_
          (string *__return_storage_ptr__,BamReaderPrivate *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_errorString);
  return __return_storage_ptr__;
}

Assistant:

string BamReaderPrivate::GetErrorString(void) const {
    return m_errorString;
}